

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O1

int Ivy_CutFindOrAddFilter(Ivy_Store_t *pCutStore,Ivy_Cut_t *pCutNew)

{
  Ivy_Cut_t *pIVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  short sVar9;
  short sVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar4 = pCutNew->uHash;
  if (uVar4 == 0) {
    __assert_fail("pCutNew->uHash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                  ,0x36d,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
  }
  iVar5 = pCutStore->nCuts;
  lVar13 = (long)iVar5;
  if (0 < lVar13) {
    piVar15 = pCutStore->pCuts[0].pArray;
    lVar16 = 0;
    do {
      uVar2 = pCutStore->pCuts[lVar16].nSize;
      if ((ulong)uVar2 != 0) {
        uVar3 = pCutNew->nSize;
        uVar14 = (uint)(short)uVar3;
        if (uVar2 == uVar3) {
          if (pCutStore->pCuts[lVar16].uHash == uVar4) {
            if ((short)uVar3 < 1) {
              uVar12 = 0;
            }
            else {
              uVar12 = 0;
              do {
                if (piVar15[uVar12] != pCutNew->pArray[uVar12]) goto LAB_0075e336;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
              uVar12 = (ulong)uVar14;
            }
LAB_0075e336:
            if ((uint)uVar12 == uVar14) {
              return 1;
            }
          }
        }
        else {
          uVar6 = pCutStore->pCuts[lVar16].uHash;
          uVar11 = uVar6 & uVar4;
          if ((short)uVar2 < (short)uVar3) {
            if (uVar11 == uVar6) {
              if ((short)uVar2 < 1) {
                return 1;
              }
              uVar12 = 0;
              do {
                if ((uVar12 != 0) &&
                   (pCutStore->pCuts[lVar16].pArray[uVar12] <=
                    pCutStore->pCuts[lVar16].pArray[uVar12 - 1])) {
LAB_0075e38c:
                  __assert_fail("i==0 || pDom->pArray[i-1] < pDom->pArray[i]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                                ,0x353,"int Ivy_CutCheckDominance(Ivy_Cut_t *, Ivy_Cut_t *)");
                }
                if ((short)uVar3 < 1) {
                  uVar18 = 0;
                }
                else {
                  uVar18 = 0;
                  do {
                    if (pCutStore->pCuts[lVar16].pArray[uVar12] == pCutNew->pArray[uVar18])
                    goto LAB_0075e2c3;
                    uVar18 = uVar18 + 1;
                  } while (uVar14 != uVar18);
                  uVar18 = (ulong)uVar14;
                }
LAB_0075e2c3:
                if ((uint)uVar18 == uVar14) break;
                uVar12 = uVar12 + 1;
                if (uVar12 == uVar2) {
                  return 1;
                }
              } while( true );
            }
          }
          else if (uVar11 == uVar4) {
            if (0 < (short)uVar3) {
              uVar14 = (uint)(short)uVar2;
              uVar12 = 0;
              do {
                if ((uVar12 != 0) && (pCutNew->pArray[uVar12] <= pCutNew->pArray[uVar12 - 1]))
                goto LAB_0075e38c;
                if ((short)uVar2 < 1) {
                  uVar18 = 0;
                }
                else {
                  uVar17 = 0;
                  do {
                    uVar18 = uVar17;
                    if (pCutNew->pArray[uVar12] == piVar15[uVar17]) break;
                    uVar17 = uVar17 + 1;
                    uVar18 = (ulong)uVar14;
                  } while (uVar14 != uVar17);
                }
                if ((uint)uVar18 == uVar14) goto LAB_0075e33a;
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar3);
            }
            pCutStore->pCuts[lVar16].nSize = 0;
          }
        }
      }
LAB_0075e33a:
      lVar16 = lVar16 + 1;
      piVar15 = piVar15 + 9;
    } while (lVar16 != lVar13);
  }
  if (iVar5 < pCutStore->nCutsMax) {
    pCutStore->nCuts = iVar5 + 1;
    pCutStore->pCuts[lVar13].uHash = pCutNew->uHash;
    iVar5 = pCutNew->nLatches;
    sVar9 = pCutNew->nSize;
    sVar10 = pCutNew->nSizeMax;
    uVar7 = *(undefined8 *)pCutNew->pArray;
    uVar8 = *(undefined8 *)(pCutNew->pArray + 4);
    piVar15 = pCutStore->pCuts[lVar13].pArray;
    *(undefined8 *)(piVar15 + 2) = *(undefined8 *)(pCutNew->pArray + 2);
    *(undefined8 *)(piVar15 + 4) = uVar8;
    pIVar1 = pCutStore->pCuts + lVar13;
    pIVar1->nLatches = iVar5;
    pIVar1->nSize = sVar9;
    pIVar1->nSizeMax = sVar10;
    *(undefined8 *)pIVar1->pArray = uVar7;
    return 0;
  }
  __assert_fail("pCutStore->nCuts < pCutStore->nCutsMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivySeq.c"
                ,0x396,"int Ivy_CutFindOrAddFilter(Ivy_Store_t *, Ivy_Cut_t *)");
}

Assistant:

int Ivy_CutFindOrAddFilter( Ivy_Store_t * pCutStore, Ivy_Cut_t * pCutNew )
{
    Ivy_Cut_t * pCut;
    int i, k;
    assert( pCutNew->uHash );
    // try to find the cut
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize == pCutNew->nSize )
        {
            if ( pCut->uHash == pCutNew->uHash )
            {
                for ( k = 0; k < pCutNew->nSize; k++ )
                    if ( pCut->pArray[k] != pCutNew->pArray[k] )
                        break;
                if ( k == pCutNew->nSize )
                    return 1;
            }
            continue;
        }
        if ( pCut->nSize < pCutNew->nSize )
        {
            // skip the non-contained cuts
            if ( (pCut->uHash & pCutNew->uHash) != pCut->uHash )
                continue;
            // check containment seriously
            if ( Ivy_CutCheckDominance( pCut, pCutNew ) )
                return 1;
            continue;
        }
        // check potential containment of other cut

        // skip the non-contained cuts
        if ( (pCut->uHash & pCutNew->uHash) != pCutNew->uHash )
            continue;
        // check containment seriously
        if ( Ivy_CutCheckDominance( pCutNew, pCut ) )
        {
            // remove the current cut
            pCut->nSize = 0;
        }
    }
    assert( pCutStore->nCuts < pCutStore->nCutsMax );
    // add the cut
    pCut = pCutStore->pCuts + pCutStore->nCuts++;
    *pCut = *pCutNew;
    return 0;
}